

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O2

void __thiscall
TestSchema::readData<avro::Parser<avro::ReaderImpl<avro::NullValidator>>>
          (TestSchema *this,Parser<avro::ReaderImpl<avro::NullValidator>_> *p)

{
  TestSchema *this_00;
  undefined **ppuVar1;
  int32_t iVar2;
  ostream *poVar3;
  bool boolval;
  int32_t intval;
  undefined4 uStack_134;
  int64_t longval;
  TestSchema *local_128;
  undefined **local_120;
  undefined4 local_114;
  undefined **local_110;
  undefined1 local_108;
  undefined8 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  const_string local_e0;
  const_string local_d0;
  char *local_c0;
  char *local_b8;
  const_string local_b0;
  const_string local_a0;
  char *local_90;
  char *local_88;
  const_string local_80;
  const_string local_70;
  char *local_60;
  char *local_58;
  const_string local_50;
  const_string local_40;
  
  longval = avro::Parser<avro::ReaderImpl<avro::NullValidator>_>::readLong(p);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::operator<<(poVar3,'\n');
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)poVar3,&local_40,0x162,&local_50);
  local_108 = 0;
  local_120 = &PTR__lazy_ostream_001f1370;
  local_110 = &PTR__lazy_ostream_001f1370;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_58 = "";
  _intval = CONCAT44(uStack_134,1000);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_110,&local_60,0x162,1,2,&longval,"longval",&intval,"1000");
  local_128 = this;
  readMap<avro::Parser<avro::ReaderImpl<avro::NullValidator>>>(this,p);
  readArray<avro::Parser<avro::ReaderImpl<avro::NullValidator>>>(this,p);
  longval = avro::ReaderImpl<avro::NullValidator>::readSize(&p->reader_);
  poVar3 = std::operator<<((ostream *)&std::cout,"Enum choice ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::operator<<(poVar3,'\n');
  longval = avro::ReaderImpl<avro::NullValidator>::readSize(&p->reader_);
  poVar3 = std::operator<<((ostream *)&std::cout,"Union path ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::operator<<(poVar3,'\n');
  this_00 = local_128;
  readMap<avro::Parser<avro::ReaderImpl<avro::NullValidator>>>(local_128,p);
  readNestedRecord<avro::Parser<avro::ReaderImpl<avro::NullValidator>>>(this_00,p);
  boolval = avro::Parser<avro::ReaderImpl<avro::NullValidator>_>::readBool(p);
  poVar3 = std::ostream::_M_insert<bool>(true);
  std::operator<<(poVar3,'\n');
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)poVar3,&local_70,0x175,&local_80);
  ppuVar1 = local_120;
  local_108 = 0;
  local_110 = local_120;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_88 = "";
  _intval = CONCAT71(stack0xfffffffffffffec9,1);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (&local_110,&local_90,0x175,1,2,&boolval,"boolval",&intval,"true");
  readFixed<avro::Parser<avro::ReaderImpl<avro::NullValidator>>>(this_00,p);
  longval = avro::Parser<avro::ReaderImpl<avro::NullValidator>_>::readLong(p);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::operator<<(poVar3,'\n');
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_a0.m_end = "";
  local_b0.m_begin = "";
  local_b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)poVar3,&local_a0,0x17d,&local_b0);
  local_108 = 0;
  local_110 = ppuVar1;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_b8 = "";
  _intval = 0x614b1cb2bfaa4383;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (&local_110,&local_c0,0x17d,1,2,&longval,"longval",&intval,"7010728798977672067LL");
  iVar2 = avro::Parser<avro::ReaderImpl<avro::NullValidator>_>::readInt(p);
  _intval = CONCAT44(uStack_134,iVar2);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
  std::operator<<(poVar3,'\n');
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_d0.m_end = "";
  local_e0.m_begin = "";
  local_e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)poVar3,&local_d0,0x182,&local_e0);
  local_108 = 0;
  local_110 = ppuVar1;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_e8 = "";
  local_114 = 0xfffff280;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_110,&local_f0,0x182,1,2,&intval,"intval",&local_114,"-3456");
  return;
}

Assistant:

void readData(Parser &p)
    {
        printNext(p);
        p.readRecord();

        printNext(p);
        int64_t longval = p.readLong();
        std::cout << longval << '\n';
        BOOST_CHECK_EQUAL(longval, 1000);

        readMap(p);
        readArray(p);

        printNext(p);
        longval = p.readEnum();
        std::cout << "Enum choice " << longval << '\n';

        printNext(p);
        longval = p.readUnion();
        std::cout << "Union path " << longval << '\n';
        readMap(p);

        readNestedRecord(p);

        printNext(p);
        bool boolval = p.readBool();
        std::cout << boolval << '\n';
        BOOST_CHECK_EQUAL(boolval, true);

        printNext(p);
        readFixed(p);

        printNext(p);
        longval = p.readLong();
        std::cout << longval << '\n';
        BOOST_CHECK_EQUAL(longval, 7010728798977672067LL);

        printNext(p);
        int32_t intval = p.readInt();
        std::cout << intval << '\n';
        BOOST_CHECK_EQUAL(intval, -3456);
        p.readRecordEnd();
    }